

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasn_dec.cc
# Opt level: O2

int asn1_item_ex_d2i(ASN1_VALUE **pval,uchar **in,long len,ASN1_ITEM *it,int tag,int aclass,char opt
                    ,CRYPTO_BUFFER *buf,int depth)

{
  uint8_t *puVar1;
  uchar **ppuVar2;
  uchar *puVar3;
  CRYPTO_BUFFER *buf_00;
  ASN1_ITEM *it_00;
  byte opt_00;
  int iVar4;
  uint uVar5;
  uint8_t *puVar6;
  size_t sVar7;
  ASN1_VALUE **ppAVar8;
  ASN1_TEMPLATE *pAVar9;
  ASN1_TEMPLATE *pAVar10;
  ulong uVar11;
  int exptag;
  char *cst_00;
  int iVar12;
  code *pcVar13;
  ASN1_TEMPLATE *pAVar14;
  long lVar15;
  undefined1 *puVar16;
  code *pcVar17;
  uchar oclass;
  uchar **local_70;
  uchar *p;
  code *local_60;
  long len_local;
  char cst;
  CRYPTO_BUFFER *local_48;
  code *local_40;
  ASN1_ITEM *local_38;
  
  p = (uchar *)0x0;
  if (pval == (ASN1_VALUE **)0x0) {
    return 0;
  }
  local_70 = (uchar **)CONCAT44(local_70._4_4_,tag);
  local_60 = (code *)CONCAT44(local_60._4_4_,aclass);
  len_local = len;
  local_38 = (ASN1_ITEM *)it;
  if (buf != (CRYPTO_BUFFER *)0x0) {
    puVar6 = CRYPTO_BUFFER_data(buf);
    puVar1 = *in;
    if (puVar1 < puVar6) {
LAB_003cc26f:
      __assert_fail("CRYPTO_BUFFER_data(buf) <= *in && *in + len <= CRYPTO_BUFFER_data(buf) + CRYPTO_BUFFER_len(buf)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_dec.cc"
                    ,0xa7,
                    "int asn1_item_ex_d2i(ASN1_VALUE **, const unsigned char **, long, const ASN1_ITEM *, int, int, char, CRYPTO_BUFFER *, int)"
                   );
    }
    puVar6 = CRYPTO_BUFFER_data(buf);
    sVar7 = CRYPTO_BUFFER_len(buf);
    if (puVar6 + sVar7 < puVar1 + len) goto LAB_003cc26f;
  }
  it_00 = local_38;
  if (0x3fffffff < len) {
    len_local = 0x3fffffff;
    len = 0x3fffffff;
  }
  if (0x1d < depth) {
    pAVar14 = (ASN1_TEMPLATE *)0x0;
    iVar12 = 0xc0;
    iVar4 = 0xb1;
    goto LAB_003cba2d;
  }
  if (5 < (byte)local_38->itype) {
    return 0;
  }
  iVar12 = depth + 1;
  switch(local_38->itype) {
  case '\0':
    if ((ASN1_TEMPLATE *)local_38->utype == (ASN1_TEMPLATE *)0x0) {
      iVar12 = asn1_d2i_ex_primitive
                         (pval,in,len,(ASN1_ITEM *)local_38,(int)local_70,(int)local_60,opt);
      return iVar12;
    }
    if ((int)local_70 == -1 && opt == '\0') {
      iVar12 = asn1_template_ex_d2i(pval,in,len,(ASN1_TEMPLATE *)local_38->utype,'\0',buf,iVar12);
      return iVar12;
    }
    iVar12 = 0x88;
    iVar4 = 0xbd;
    break;
  case '\x01':
    p = *in;
    iVar4 = (int)local_60;
    if ((int)local_70 == -1) {
      iVar4 = 0;
    }
    exptag = 0x10;
    if ((int)local_70 != -1) {
      exptag = (int)local_70;
    }
    cst_00 = &cst;
    iVar4 = asn1_check_tlen(&len_local,(int *)0x0,(uchar *)0x0,cst_00,&p,len,exptag,iVar4,opt);
    if (iVar4 == -1) {
      return -1;
    }
    if (iVar4 == 0) {
      pAVar14 = (ASN1_TEMPLATE *)0x0;
      iVar12 = 0x9e;
      iVar4 = 0x143;
      goto LAB_003cba2d;
    }
    local_48 = buf;
    if (cst == '\0') {
      iVar12 = 0xa9;
      iVar4 = 0x149;
    }
    else {
      if ((*pval != (ASN1_VALUE *)0x0) ||
         (iVar4 = ASN1_item_ex_new((ASN1_VALUE **)pval,it_00), iVar4 != 0)) {
        local_60 = (code *)CONCAT71((int7)((ulong)cst_00 >> 8),1);
        if ((it_00->tcount == 0) ||
           (pcVar13 = *(code **)(it_00->tcount + 0x10), pcVar13 == (code *)0x0)) {
          pcVar13 = (code *)0x0;
          local_70 = in;
        }
        else {
          local_60 = (code *)0x0;
          local_70 = in;
          iVar4 = (*pcVar13)(4,pval,it_00,0);
          if (iVar4 == 0) goto LAB_003cc20c;
        }
        pAVar14 = (ASN1_TEMPLATE *)it_00->utype;
        local_40 = pcVar13;
        for (lVar15 = 0; pAVar10 = it_00->templates, lVar15 < (long)pAVar10; lVar15 = lVar15 + 1) {
          if (((pAVar14->flags & 0x300) != 0) &&
             (pAVar10 = asn1_do_adb((ASN1_VALUE **)pval,pAVar14,0), pAVar10 != (ASN1_TEMPLATE *)0x0)
             ) {
            ppAVar8 = asn1_get_field_ptr((ASN1_VALUE **)pval,pAVar10);
            ASN1_template_free(ppAVar8,pAVar10);
          }
          pAVar14 = (ASN1_TEMPLATE *)&pAVar14->item;
        }
        pAVar9 = (ASN1_TEMPLATE *)it_00->utype;
        for (puVar16 = (undefined1 *)0x0; (long)puVar16 < (long)pAVar10; puVar16 = puVar16 + 1) {
          pAVar14 = asn1_do_adb((ASN1_VALUE **)pval,pAVar9,1);
          if (pAVar14 == (ASN1_TEMPLATE *)0x0) {
            pAVar14 = (ASN1_TEMPLATE *)0x0;
            goto LAB_003cba37;
          }
          ppAVar8 = asn1_get_field_ptr((ASN1_VALUE **)pval,pAVar14);
          puVar3 = p;
          if (len_local == 0) goto LAB_003cc0dd;
          if (puVar16 == (undefined1 *)((long)&it_00->templates[-1].item + 7U)) {
            opt_00 = 0;
          }
          else {
            opt_00 = (byte)pAVar14->flags & 1;
          }
          iVar4 = asn1_template_ex_d2i
                            ((ASN1_VALUE **)ppAVar8,&p,len_local,(ASN1_TEMPLATE *)pAVar14,opt_00,
                             local_48,iVar12);
          if (iVar4 == -1) {
            ASN1_template_free(ppAVar8,pAVar14);
          }
          else {
            if (iVar4 == 0) goto LAB_003cba37;
            len_local = (long)(puVar3 + (len_local - (long)p));
          }
          pAVar9 = (ASN1_TEMPLATE *)&pAVar9->item;
          pAVar10 = it_00->templates;
        }
        if (len_local == 0) {
LAB_003cc0dd:
          ppuVar2 = local_70;
          for (uVar11 = (ulong)puVar16 & 0xffffffff; (long)uVar11 < (long)it_00->templates;
              uVar11 = uVar11 + 1) {
            pAVar14 = asn1_do_adb((ASN1_VALUE **)pval,pAVar9,1);
            if (pAVar14 == (ASN1_TEMPLATE *)0x0) {
              pAVar14 = (ASN1_TEMPLATE *)0x0;
              goto LAB_003cba37;
            }
            if ((pAVar14->flags & 1) == 0) {
              iVar12 = 0x79;
              iVar4 = 0x1a1;
              goto LAB_003cba2d;
            }
            ppAVar8 = asn1_get_field_ptr((ASN1_VALUE **)pval,pAVar14);
            ASN1_template_free(ppAVar8,pAVar14);
            pAVar9 = (ASN1_TEMPLATE *)&pAVar9->item;
          }
          iVar12 = asn1_enc_save((ASN1_VALUE **)pval,*ppuVar2,(int)p - (int)*ppuVar2,it_00);
          if ((iVar12 != 0) &&
             (((char)local_60 != '\0' || (iVar12 = (*local_40)(5,pval,it_00,0), iVar12 != 0)))) {
            *local_70 = p;
            return 1;
          }
          goto LAB_003cc20c;
        }
        pAVar14 = (ASN1_TEMPLATE *)0x0;
        iVar12 = 0xa8;
        iVar4 = 0x18e;
        goto LAB_003cba2d;
      }
      iVar12 = 0x9e;
      iVar4 = 0x14e;
    }
    break;
  case '\x02':
    if ((int)local_70 == -1) {
      pcVar13 = (code *)CONCAT71((int7)((ulong)len >> 8),1);
      local_48 = buf;
      if ((local_38->tcount == 0) ||
         (pcVar17 = *(code **)(local_38->tcount + 0x10), pcVar17 == (code *)0x0)) {
        pcVar17 = (code *)0x0;
        local_70 = in;
LAB_003cbda9:
        if (*pval == (ASN1_VALUE *)0x0) {
          iVar4 = ASN1_item_ex_new((ASN1_VALUE **)pval,it_00);
          if (iVar4 == 0) {
            iVar12 = 0x9e;
            iVar4 = 0x10d;
            break;
          }
        }
        else {
          uVar5 = asn1_get_choice_selector((ASN1_VALUE **)pval,it_00);
          if ((-1 < (int)uVar5) && ((long)(ulong)uVar5 < (long)it_00->templates)) {
            pAVar14 = (ASN1_TEMPLATE *)((ulong)uVar5 * 0x20 + it_00->utype);
            ppAVar8 = asn1_get_field_ptr((ASN1_VALUE **)pval,pAVar14);
            ASN1_template_free(ppAVar8,pAVar14);
            asn1_set_choice_selector((ASN1_VALUE **)pval,-1,it_00);
          }
        }
        buf_00 = local_48;
        p = *local_70;
        pAVar14 = (ASN1_TEMPLATE *)it_00->utype;
        local_60 = pcVar17;
        local_40 = pcVar13;
        for (pAVar10 = (ASN1_TEMPLATE *)0x0; pAVar9 = it_00->templates, (long)pAVar10 < (long)pAVar9
            ; pAVar10 = (ASN1_TEMPLATE *)((long)&pAVar10->flags + 1)) {
          ppAVar8 = asn1_get_field_ptr((ASN1_VALUE **)pval,pAVar14);
          iVar4 = asn1_template_ex_d2i
                            ((ASN1_VALUE **)ppAVar8,&p,len_local,(ASN1_TEMPLATE *)pAVar14,'\x01',
                             buf_00,iVar12);
          if (iVar4 != -1) {
            if (iVar4 < 1) {
              iVar12 = 0x9e;
              iVar4 = 0x120;
              goto LAB_003cba2d;
            }
            pAVar9 = it_00->templates;
            break;
          }
          pAVar14 = (ASN1_TEMPLATE *)&pAVar14->item;
        }
        if (pAVar9 == pAVar10) {
          if (opt != '\0') {
            ASN1_item_ex_free((ASN1_VALUE **)pval,it_00);
            return -1;
          }
          pAVar14 = (ASN1_TEMPLATE *)0x0;
          iVar12 = 0xa3;
          iVar4 = 300;
          goto LAB_003cba2d;
        }
        asn1_set_choice_selector((ASN1_VALUE **)pval,(int)pAVar10,it_00);
        if (((char)local_40 != '\0') || (iVar12 = (*local_60)(5,pval,it_00,0), iVar12 != 0)) {
          *local_70 = p;
          return 1;
        }
      }
      else {
        pcVar13 = (code *)0x0;
        local_70 = in;
        iVar4 = (*pcVar17)(4,pval,local_38,0);
        if (iVar4 != 0) goto LAB_003cbda9;
      }
LAB_003cc20c:
      pAVar14 = (ASN1_TEMPLATE *)0x0;
      iVar12 = 0x65;
      iVar4 = 0x1b4;
    }
    else {
      pAVar14 = (ASN1_TEMPLATE *)0x0;
      iVar12 = 0xc1;
      iVar4 = 0xf9;
    }
    goto LAB_003cba2d;
  case '\x03':
    goto LAB_003cbb00;
  case '\x04':
    if ((int)local_70 == -1) {
      iVar12 = (**(code **)(local_38->tcount + 0x10))(pval,in,len,local_38,(int)opt,0);
      return iVar12;
    }
    pAVar14 = (ASN1_TEMPLATE *)0x0;
    iVar12 = 0xc1;
    iVar4 = 0xed;
LAB_003cba2d:
    ERR_put_error(0xc,0,iVar12,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_dec.cc"
                  ,iVar4);
    goto LAB_003cba37;
  case '\x05':
    if ((int)local_70 != -1) {
      pAVar14 = (ASN1_TEMPLATE *)0x0;
      iVar12 = 0xc1;
      iVar4 = 0xca;
      goto LAB_003cba2d;
    }
    p = *in;
    iVar12 = asn1_check_tlen((long *)0x0,(int *)&cst,&oclass,(char *)0x0,&p,len,-1,0,'\x01');
    if (iVar12 == 0) {
      iVar12 = 0x9e;
      iVar4 = 0xd2;
    }
    else if (oclass == '\0') {
      uVar11 = ASN1_tag2bit(_cst);
      if ((*(uint *)&it_00->field_0x4 & (uint)uVar11) != 0) {
        iVar12 = asn1_d2i_ex_primitive(pval,in,len_local,(ASN1_ITEM *)it_00,_cst,0,'\0');
        return iVar12;
      }
      if (opt != '\0') {
        return -1;
      }
      iVar12 = 0x9d;
      iVar4 = 0xe5;
    }
    else {
      if (opt != '\0') {
        return -1;
      }
      iVar12 = 0x9c;
      iVar4 = 0xdc;
    }
  }
  pAVar14 = (ASN1_TEMPLATE *)0x0;
  ERR_put_error(0xc,0,iVar12,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_dec.cc"
                ,iVar4);
LAB_003cba37:
  ASN1_item_ex_free((ASN1_VALUE **)pval,it_00);
  if (pAVar14 == (ASN1_TEMPLATE *)0x0) {
    ERR_add_error_data(2,"Type=",it_00->size);
  }
  else {
    ERR_add_error_data(4,"Field=",pAVar14->offset,", Type=",it_00->size);
  }
LAB_003cbb00:
  return 0;
}

Assistant:

static int asn1_item_ex_d2i(ASN1_VALUE **pval, const unsigned char **in,
                            long len, const ASN1_ITEM *it, int tag, int aclass,
                            char opt, CRYPTO_BUFFER *buf, int depth) {
  const ASN1_TEMPLATE *tt, *errtt = NULL;
  const unsigned char *p = NULL, *q;
  unsigned char oclass;
  char cst, isopt;
  int i;
  int otag;
  int ret = 0;
  ASN1_VALUE **pchptr;
  if (!pval) {
    return 0;
  }

  if (buf != NULL) {
    assert(CRYPTO_BUFFER_data(buf) <= *in &&
           *in + len <= CRYPTO_BUFFER_data(buf) + CRYPTO_BUFFER_len(buf));
  }

  // Bound |len| to comfortably fit in an int. Lengths in this module often
  // switch between int and long without overflow checks.
  if (len > INT_MAX / 2) {
    len = INT_MAX / 2;
  }

  if (++depth > ASN1_MAX_CONSTRUCTED_NEST) {
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_NESTED_TOO_DEEP);
    goto err;
  }

  switch (it->itype) {
    case ASN1_ITYPE_PRIMITIVE:
      if (it->templates) {
        // tagging or OPTIONAL is currently illegal on an item template
        // because the flags can't get passed down. In practice this
        // isn't a problem: we include the relevant flags from the item
        // template in the template itself.
        if ((tag != -1) || opt) {
          OPENSSL_PUT_ERROR(ASN1, ASN1_R_ILLEGAL_OPTIONS_ON_ITEM_TEMPLATE);
          goto err;
        }
        return asn1_template_ex_d2i(pval, in, len, it->templates, opt, buf,
                                    depth);
      }
      return asn1_d2i_ex_primitive(pval, in, len, it, tag, aclass, opt);
      break;

    case ASN1_ITYPE_MSTRING:
      // It never makes sense for multi-strings to have implicit tagging, so
      // if tag != -1, then this looks like an error in the template.
      if (tag != -1) {
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_BAD_TEMPLATE);
        goto err;
      }

      p = *in;
      // Just read in tag and class
      ret = asn1_check_tlen(NULL, &otag, &oclass, NULL, &p, len, -1, 0, 1);
      if (!ret) {
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_NESTED_ASN1_ERROR);
        goto err;
      }

      // Must be UNIVERSAL class
      if (oclass != V_ASN1_UNIVERSAL) {
        // If OPTIONAL, assume this is OK
        if (opt) {
          return -1;
        }
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_MSTRING_NOT_UNIVERSAL);
        goto err;
      }
      // Check tag matches bit map
      if (!(ASN1_tag2bit(otag) & it->utype)) {
        // If OPTIONAL, assume this is OK
        if (opt) {
          return -1;
        }
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_MSTRING_WRONG_TAG);
        goto err;
      }
      return asn1_d2i_ex_primitive(pval, in, len, it, otag, 0, 0);

    case ASN1_ITYPE_EXTERN: {
      // We don't support implicit tagging with external types.
      if (tag != -1) {
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_BAD_TEMPLATE);
        goto err;
      }
      const ASN1_EXTERN_FUNCS *ef =
          reinterpret_cast<const ASN1_EXTERN_FUNCS *>(it->funcs);
      return ef->asn1_ex_d2i(pval, in, len, it, opt, NULL);
    }

    case ASN1_ITYPE_CHOICE: {
      // It never makes sense for CHOICE types to have implicit tagging, so if
      // tag != -1, then this looks like an error in the template.
      if (tag != -1) {
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_BAD_TEMPLATE);
        goto err;
      }

      const ASN1_AUX *aux = reinterpret_cast<const ASN1_AUX *>(it->funcs);
      ASN1_aux_cb *asn1_cb = aux != NULL ? aux->asn1_cb : NULL;
      if (asn1_cb && !asn1_cb(ASN1_OP_D2I_PRE, pval, it, NULL)) {
        goto auxerr;
      }

      if (*pval) {
        // Free up and zero CHOICE value if initialised
        i = asn1_get_choice_selector(pval, it);
        if ((i >= 0) && (i < it->tcount)) {
          tt = it->templates + i;
          pchptr = asn1_get_field_ptr(pval, tt);
          ASN1_template_free(pchptr, tt);
          asn1_set_choice_selector(pval, -1, it);
        }
      } else if (!ASN1_item_ex_new(pval, it)) {
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_NESTED_ASN1_ERROR);
        goto err;
      }
      // CHOICE type, try each possibility in turn
      p = *in;
      for (i = 0, tt = it->templates; i < it->tcount; i++, tt++) {
        pchptr = asn1_get_field_ptr(pval, tt);
        // We mark field as OPTIONAL so its absence can be recognised.
        ret = asn1_template_ex_d2i(pchptr, &p, len, tt, 1, buf, depth);
        // If field not present, try the next one
        if (ret == -1) {
          continue;
        }
        // If positive return, read OK, break loop
        if (ret > 0) {
          break;
        }
        // Otherwise must be an ASN1 parsing error
        errtt = tt;
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_NESTED_ASN1_ERROR);
        goto err;
      }

      // Did we fall off the end without reading anything?
      if (i == it->tcount) {
        // If OPTIONAL, this is OK
        if (opt) {
          // Free and zero it
          ASN1_item_ex_free(pval, it);
          return -1;
        }
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_NO_MATCHING_CHOICE_TYPE);
        goto err;
      }

      asn1_set_choice_selector(pval, i, it);
      if (asn1_cb && !asn1_cb(ASN1_OP_D2I_POST, pval, it, NULL)) {
        goto auxerr;
      }
      *in = p;
      return 1;
    }

    case ASN1_ITYPE_SEQUENCE: {
      p = *in;

      // If no IMPLICIT tagging set to SEQUENCE, UNIVERSAL
      if (tag == -1) {
        tag = V_ASN1_SEQUENCE;
        aclass = V_ASN1_UNIVERSAL;
      }
      // Get SEQUENCE length and update len, p
      ret = asn1_check_tlen(&len, NULL, NULL, &cst, &p, len, tag, aclass, opt);
      if (!ret) {
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_NESTED_ASN1_ERROR);
        goto err;
      } else if (ret == -1) {
        return -1;
      }
      if (!cst) {
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_SEQUENCE_NOT_CONSTRUCTED);
        goto err;
      }

      if (!*pval && !ASN1_item_ex_new(pval, it)) {
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_NESTED_ASN1_ERROR);
        goto err;
      }

      const ASN1_AUX *aux = reinterpret_cast<const ASN1_AUX *>(it->funcs);
      ASN1_aux_cb *asn1_cb = aux != NULL ? aux->asn1_cb : NULL;
      if (asn1_cb && !asn1_cb(ASN1_OP_D2I_PRE, pval, it, NULL)) {
        goto auxerr;
      }

      // Free up and zero any ADB found
      for (i = 0, tt = it->templates; i < it->tcount; i++, tt++) {
        if (tt->flags & ASN1_TFLG_ADB_MASK) {
          const ASN1_TEMPLATE *seqtt;
          ASN1_VALUE **pseqval;
          seqtt = asn1_do_adb(pval, tt, 0);
          if (seqtt == NULL) {
            continue;
          }
          pseqval = asn1_get_field_ptr(pval, seqtt);
          ASN1_template_free(pseqval, seqtt);
        }
      }

      // Get each field entry
      for (i = 0, tt = it->templates; i < it->tcount; i++, tt++) {
        const ASN1_TEMPLATE *seqtt;
        ASN1_VALUE **pseqval;
        seqtt = asn1_do_adb(pval, tt, 1);
        if (seqtt == NULL) {
          goto err;
        }
        pseqval = asn1_get_field_ptr(pval, seqtt);
        // Have we ran out of data?
        if (!len) {
          break;
        }
        q = p;
        // This determines the OPTIONAL flag value. The field cannot be
        // omitted if it is the last of a SEQUENCE and there is still
        // data to be read. This isn't strictly necessary but it
        // increases efficiency in some cases.
        if (i == (it->tcount - 1)) {
          isopt = 0;
        } else {
          isopt = (seqtt->flags & ASN1_TFLG_OPTIONAL) != 0;
        }
        // attempt to read in field, allowing each to be OPTIONAL

        ret = asn1_template_ex_d2i(pseqval, &p, len, seqtt, isopt, buf, depth);
        if (!ret) {
          errtt = seqtt;
          goto err;
        } else if (ret == -1) {
          // OPTIONAL component absent. Free and zero the field.
          ASN1_template_free(pseqval, seqtt);
          continue;
        }
        // Update length
        len -= p - q;
      }

      // Check all data read
      if (len) {
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_SEQUENCE_LENGTH_MISMATCH);
        goto err;
      }

      // If we get here we've got no more data in the SEQUENCE, however we
      // may not have read all fields so check all remaining are OPTIONAL
      // and clear any that are.
      for (; i < it->tcount; tt++, i++) {
        const ASN1_TEMPLATE *seqtt;
        seqtt = asn1_do_adb(pval, tt, 1);
        if (seqtt == NULL) {
          goto err;
        }
        if (seqtt->flags & ASN1_TFLG_OPTIONAL) {
          ASN1_VALUE **pseqval;
          pseqval = asn1_get_field_ptr(pval, seqtt);
          ASN1_template_free(pseqval, seqtt);
        } else {
          errtt = seqtt;
          OPENSSL_PUT_ERROR(ASN1, ASN1_R_FIELD_MISSING);
          goto err;
        }
      }
      // Save encoding
      if (!asn1_enc_save(pval, *in, p - *in, it, buf)) {
        goto auxerr;
      }
      if (asn1_cb && !asn1_cb(ASN1_OP_D2I_POST, pval, it, NULL)) {
        goto auxerr;
      }
      *in = p;
      return 1;
    }

    default:
      return 0;
  }
auxerr:
  OPENSSL_PUT_ERROR(ASN1, ASN1_R_AUX_ERROR);
err:
  ASN1_item_ex_free(pval, it);
  if (errtt) {
    ERR_add_error_data(4, "Field=", errtt->field_name, ", Type=", it->sname);
  } else {
    ERR_add_error_data(2, "Type=", it->sname);
  }
  return 0;
}